

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# M3DImporter.cpp
# Opt level: O1

void __thiscall Assimp::M3DImporter::importMeshes(M3DImporter *this,M3DWrapper *m3d)

{
  M3D_INDEX MVar1;
  uint uVar2;
  m3dv_t *pmVar3;
  iterator iVar4;
  iterator __position;
  iterator __position_00;
  m3dti_t *pmVar5;
  iterator iVar6;
  aiScene *paVar7;
  M3D_INDEX MVar8;
  M3DImporter *pMVar9;
  vector<aiMesh*,std::allocator<aiMesh*>> *pvVar10;
  Logger *this_00;
  m3d_t *pmVar11;
  aiMesh *paVar12;
  vector<aiVector3t<float>,std::allocator<aiVector3t<float>>> *this_01;
  value_type *__x;
  uint *puVar13;
  aiMesh **ppaVar14;
  ulong uVar15;
  size_t __n;
  void *pvVar16;
  vector<aiFace,_std::allocator<aiFace>_> *faces;
  long lVar17;
  long lVar18;
  uint l;
  vector<unsigned_int,std::allocator<unsigned_int>> *local_230;
  vector<aiVector3t<float>,std::allocator<aiVector3t<float>>> *local_228;
  vector<aiVector3t<float>,std::allocator<aiVector3t<float>>> *local_220;
  vector<aiColor4t<float>,std::allocator<aiColor4t<float>>> *local_218;
  aiMesh *pMesh;
  aiVector3D norm;
  aiVector3D uv;
  aiVector3D pos;
  long local_1d8 [2];
  M3DImporter *local_1c8;
  vector<aiMesh*,std::allocator<aiMesh*>> *local_1c0;
  vector<aiFace,_std::allocator<aiFace>_> *local_1b8;
  ulong local_1b0;
  undefined1 local_1a8 [8];
  float fStack_1a0;
  float fStack_19c;
  ios_base local_138 [264];
  
  pvVar10 = (vector<aiMesh*,std::allocator<aiMesh*>> *)operator_new(0x18);
  *(undefined8 *)pvVar10 = 0;
  *(undefined8 *)(pvVar10 + 8) = 0;
  *(undefined8 *)(pvVar10 + 0x10) = 0;
  pMesh = (aiMesh *)0x0;
  if (this->mScene == (aiScene *)0x0) {
    __assert_fail("mScene != nullptr",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/quantumsheep[P]unicy/libs/assimp/code/M3D/M3DImporter.cpp"
                  ,0x180,"void Assimp::M3DImporter::importMeshes(const M3DWrapper &)");
  }
  if (m3d->m3d_ == (m3d_t *)0x0) {
    __assert_fail("m3d",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/quantumsheep[P]unicy/libs/assimp/code/M3D/M3DImporter.cpp"
                  ,0x181,"void Assimp::M3DImporter::importMeshes(const M3DWrapper &)");
  }
  if (this->mScene->mRootNode == (aiNode *)0x0) {
    __assert_fail("mScene->mRootNode != nullptr",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/quantumsheep[P]unicy/libs/assimp/code/M3D/M3DImporter.cpp"
                  ,0x182,"void Assimp::M3DImporter::importMeshes(const M3DWrapper &)");
  }
  this_00 = DefaultLogger::get();
  Formatter::basic_formatter<char,_std::char_traits<char>,_std::allocator<char>_>::
  basic_formatter<char[19]>
            ((basic_formatter<char,_std::char_traits<char>,_std::allocator<char>_> *)local_1a8,
             (char (*) [19])"M3D: importMeshes ");
  std::ostream::_M_insert<unsigned_long>((ulong)local_1a8);
  std::__cxx11::stringbuf::str();
  Logger::debug(this_00,(char *)pos._0_8_);
  local_1c8 = this;
  local_1c0 = pvVar10;
  if ((long *)pos._0_8_ != local_1d8) {
    operator_delete((void *)pos._0_8_,local_1d8[0] + 1);
  }
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1a8);
  std::ios_base::~ios_base(local_138);
  pmVar11 = m3d->m3d_;
  if (pmVar11->numface == 0) {
    faces = (vector<aiFace,_std::allocator<aiFace>_> *)0x0;
    this_01 = (vector<aiVector3t<float>,std::allocator<aiVector3t<float>>> *)0x0;
    local_228 = (vector<aiVector3t<float>,std::allocator<aiVector3t<float>>> *)0x0;
    local_220 = (vector<aiVector3t<float>,std::allocator<aiVector3t<float>>> *)0x0;
    local_218 = (vector<aiColor4t<float>,std::allocator<aiColor4t<float>>> *)0x0;
    local_230 = (vector<unsigned_int,std::allocator<unsigned_int>> *)0x0;
  }
  else {
    MVar8 = 0xfffffffe;
    lVar18 = 0;
    uVar15 = 0;
    local_230 = (vector<unsigned_int,std::allocator<unsigned_int>> *)0x0;
    local_218 = (vector<aiColor4t<float>,std::allocator<aiColor4t<float>>> *)0x0;
    local_220 = (vector<aiVector3t<float>,std::allocator<aiVector3t<float>>> *)0x0;
    local_228 = (vector<aiVector3t<float>,std::allocator<aiVector3t<float>>> *)0x0;
    this_01 = (vector<aiVector3t<float>,std::allocator<aiVector3t<float>>> *)0x0;
    faces = (vector<aiFace,_std::allocator<aiFace>_> *)0x0;
    do {
      MVar1 = pmVar11->face[uVar15].materialid;
      local_1b0 = uVar15;
      if (MVar8 != MVar1) {
        if (((this_01 != (vector<aiVector3t<float>,std::allocator<aiVector3t<float>>> *)0x0 &&
              pMesh != (aiMesh *)0x0) &&
            (faces != (vector<aiFace,_std::allocator<aiFace>_> *)0x0 &&
             *(pointer *)(this_01 + 8) != *(pointer *)this_01)) &&
           ((faces->super__Vector_base<aiFace,_std::allocator<aiFace>_>)._M_impl.
            super__Vector_impl_data._M_finish !=
            (faces->super__Vector_base<aiFace,_std::allocator<aiFace>_>)._M_impl.
            super__Vector_impl_data._M_start)) {
          populateMesh(local_1c8,m3d,pMesh,faces,
                       (vector<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_> *)this_01,
                       (vector<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_> *)local_228,
                       (vector<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_> *)local_220,
                       (vector<aiColor4t<float>,_std::allocator<aiColor4t<float>_>_> *)local_218,
                       (vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_230);
          iVar6._M_current = *(aiMesh ***)(local_1c0 + 8);
          if (iVar6._M_current == *(aiMesh ***)(local_1c0 + 0x10)) {
            std::vector<aiMesh*,std::allocator<aiMesh*>>::_M_realloc_insert<aiMesh*const&>
                      (local_1c0,iVar6,&pMesh);
          }
          else {
            *iVar6._M_current = pMesh;
            *(long *)(local_1c0 + 8) = *(long *)(local_1c0 + 8) + 8;
          }
          std::vector<aiFace,_std::allocator<aiFace>_>::~vector(faces);
          operator_delete(faces,0x18);
          pvVar16 = *(void **)this_01;
          if (pvVar16 != (void *)0x0) {
            operator_delete(pvVar16,(long)*(pointer *)(this_01 + 0x10) - (long)pvVar16);
          }
          operator_delete(this_01,0x18);
          if (local_228 != (vector<aiVector3t<float>,std::allocator<aiVector3t<float>>> *)0x0) {
            pvVar16 = *(void **)local_228;
            if (pvVar16 != (void *)0x0) {
              operator_delete(pvVar16,(long)*(pointer *)(local_228 + 0x10) - (long)pvVar16);
            }
            operator_delete(local_228,0x18);
          }
          if (local_220 != (vector<aiVector3t<float>,std::allocator<aiVector3t<float>>> *)0x0) {
            pvVar16 = *(void **)local_220;
            if (pvVar16 != (void *)0x0) {
              operator_delete(pvVar16,(long)*(pointer *)(local_220 + 0x10) - (long)pvVar16);
            }
            operator_delete(local_220,0x18);
          }
          if (local_218 != (vector<aiColor4t<float>,std::allocator<aiColor4t<float>>> *)0x0) {
            pvVar16 = *(void **)local_218;
            if (pvVar16 != (void *)0x0) {
              operator_delete(pvVar16,(long)*(pointer *)(local_218 + 0x10) - (long)pvVar16);
            }
            operator_delete(local_218,0x18);
          }
          if (local_230 != (vector<unsigned_int,std::allocator<unsigned_int>> *)0x0) {
            pvVar16 = *(void **)local_230;
            if (pvVar16 != (void *)0x0) {
              operator_delete(pvVar16,(long)*(pointer *)(local_230 + 0x10) - (long)pvVar16);
            }
            operator_delete(local_230,0x18);
          }
        }
        paVar12 = (aiMesh *)operator_new(0x520);
        paVar12->mPrimitiveTypes = 0;
        paVar12->mNumVertices = 0;
        paVar12->mNumFaces = 0;
        memset(&paVar12->mVertices,0,0xcc);
        paVar12->mBones = (aiBone **)0x0;
        paVar12->mMaterialIndex = 0;
        (paVar12->mName).length = 0;
        (paVar12->mName).data[0] = '\0';
        memset((paVar12->mName).data + 1,0x1b,0x3ff);
        paVar12->mNumAnimMeshes = 0;
        paVar12->mAnimMeshes = (aiAnimMesh **)0x0;
        paVar12->mMethod = 0;
        (paVar12->mAABB).mMin.x = 0.0;
        (paVar12->mAABB).mMin.y = 0.0;
        (paVar12->mAABB).mMin.z = 0.0;
        (paVar12->mAABB).mMax.x = 0.0;
        (paVar12->mAABB).mMax.y = 0.0;
        (paVar12->mAABB).mMax.z = 0.0;
        paVar12->mTextureCoords[0] = (aiVector3D *)0x0;
        paVar12->mTextureCoords[1] = (aiVector3D *)0x0;
        paVar12->mTextureCoords[2] = (aiVector3D *)0x0;
        paVar12->mTextureCoords[3] = (aiVector3D *)0x0;
        paVar12->mTextureCoords[4] = (aiVector3D *)0x0;
        paVar12->mTextureCoords[5] = (aiVector3D *)0x0;
        paVar12->mTextureCoords[6] = (aiVector3D *)0x0;
        paVar12->mTextureCoords[7] = (aiVector3D *)0x0;
        paVar12->mNumUVComponents[0] = 0;
        paVar12->mNumUVComponents[1] = 0;
        paVar12->mNumUVComponents[2] = 0;
        paVar12->mNumUVComponents[3] = 0;
        paVar12->mNumUVComponents[4] = 0;
        paVar12->mNumUVComponents[5] = 0;
        paVar12->mNumUVComponents[6] = 0;
        paVar12->mNumUVComponents[7] = 0;
        paVar12->mColors[0] = (aiColor4D *)0x0;
        paVar12->mColors[1] = (aiColor4D *)0x0;
        paVar12->mColors[2] = (aiColor4D *)0x0;
        paVar12->mColors[3] = (aiColor4D *)0x0;
        paVar12->mColors[4] = (aiColor4D *)0x0;
        paVar12->mColors[5] = (aiColor4D *)0x0;
        paVar12->mColors[6] = (aiColor4D *)0x0;
        paVar12->mColors[7] = (aiColor4D *)0x0;
        paVar12->mPrimitiveTypes = 4;
        paVar12->mMaterialIndex = MVar1 + 1;
        pMesh = paVar12;
        local_1b8 = (vector<aiFace,_std::allocator<aiFace>_> *)operator_new(0x18);
        (local_1b8->super__Vector_base<aiFace,_std::allocator<aiFace>_>)._M_impl.
        super__Vector_impl_data._M_start = (pointer)0x0;
        (local_1b8->super__Vector_base<aiFace,_std::allocator<aiFace>_>)._M_impl.
        super__Vector_impl_data._M_finish = (pointer)0x0;
        (local_1b8->super__Vector_base<aiFace,_std::allocator<aiFace>_>)._M_impl.
        super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
        this_01 = (vector<aiVector3t<float>,std::allocator<aiVector3t<float>>> *)operator_new(0x18);
        *(undefined8 *)this_01 = 0;
        *(undefined8 *)(this_01 + 8) = 0;
        *(undefined8 *)(this_01 + 0x10) = 0;
        local_228 = (vector<aiVector3t<float>,std::allocator<aiVector3t<float>>> *)
                    operator_new(0x18);
        *(undefined8 *)local_228 = 0;
        *(pointer *)(local_228 + 8) = (pointer)0x0;
        *(pointer *)(local_228 + 0x10) = (pointer)0x0;
        local_220 = (vector<aiVector3t<float>,std::allocator<aiVector3t<float>>> *)
                    operator_new(0x18);
        *(undefined8 *)local_220 = 0;
        *(pointer *)(local_220 + 8) = (pointer)0x0;
        *(pointer *)(local_220 + 0x10) = (pointer)0x0;
        local_218 = (vector<aiColor4t<float>,std::allocator<aiColor4t<float>>> *)operator_new(0x18);
        *(undefined8 *)local_218 = 0;
        *(pointer *)(local_218 + 8) = (pointer)0x0;
        *(pointer *)(local_218 + 0x10) = (pointer)0x0;
        local_230 = (vector<unsigned_int,std::allocator<unsigned_int>> *)operator_new(0x18);
        *(undefined8 *)local_230 = 0;
        *(pointer *)(local_230 + 8) = (pointer)0x0;
        *(pointer *)(local_230 + 0x10) = (pointer)0x0;
        faces = local_1b8;
        MVar8 = MVar1;
      }
      local_1b8 = faces;
      __x = (value_type *)operator_new(0x10);
      __x->mIndices = (uint *)0x0;
      __x->mNumIndices = 3;
      puVar13 = (uint *)operator_new__(0xc);
      __x->mIndices = puVar13;
      lVar17 = 0;
      do {
        uv.x = 0.0;
        uv.y = 0.0;
        uv.z = 0.0;
        norm.x = 0.0;
        norm.y = 0.0;
        norm.z = 0.0;
        *(int *)((long)__x->mIndices + lVar17) =
             (int)((ulong)(*(long *)(this_01 + 8) - *(long *)this_01) >> 2) * -0x55555555;
        l = *(uint *)((long)m3d->m3d_->face->vertex + lVar17 + lVar18);
        pmVar3 = m3d->m3d_->vertex;
        pos.x = pmVar3[l].x;
        pos.y = pmVar3[l].y;
        pos.z = pmVar3[l].z;
        iVar4._M_current = *(aiVector3t<float> **)(this_01 + 8);
        if (iVar4._M_current == *(aiVector3t<float> **)(this_01 + 0x10)) {
          std::vector<aiVector3t<float>,std::allocator<aiVector3t<float>>>::
          _M_realloc_insert<aiVector3t<float>const&>(this_01,iVar4,&pos);
        }
        else {
          (iVar4._M_current)->z = pos.z;
          (iVar4._M_current)->x = pos.x;
          (iVar4._M_current)->y = pos.y;
          *(long *)(this_01 + 8) = *(long *)(this_01 + 8) + 0xc;
        }
        uVar2 = m3d->m3d_->vertex[l].color;
        fStack_19c = (float)(uVar2 >> 0x18) / 255.0;
        fStack_1a0 = (float)(uVar2 >> 0x10 & 0xff) / 255.0;
        local_1a8._4_4_ = (float)(uVar2 >> 8 & 0xff) / 255.0;
        local_1a8._0_4_ = (float)(uVar2 & 0xff) / 255.0;
        __position._M_current = *(aiColor4t<float> **)(local_218 + 8);
        if (__position._M_current == *(aiColor4t<float> **)(local_218 + 0x10)) {
          std::vector<aiColor4t<float>,std::allocator<aiColor4t<float>>>::
          _M_realloc_insert<aiColor4t<float>>(local_218,__position,(aiColor4t<float> *)local_1a8);
        }
        else {
          (__position._M_current)->r = (float)local_1a8._0_4_;
          (__position._M_current)->g = (float)local_1a8._4_4_;
          (__position._M_current)->b = fStack_1a0;
          (__position._M_current)->a = fStack_19c;
          *(long *)(local_218 + 8) = *(long *)(local_218 + 8) + 0x10;
        }
        pmVar11 = m3d->m3d_;
        if (((pmVar11->vertex[l].skinid < 0xfffffffe) && (pmVar11->skin != (m3ds_t *)0x0)) &&
           (pmVar11->bone != (m3db_t *)0x0)) {
          __position_00._M_current = *(uint **)(local_230 + 8);
          if (__position_00._M_current == *(uint **)(local_230 + 0x10)) {
            std::vector<unsigned_int,std::allocator<unsigned_int>>::
            _M_realloc_insert<unsigned_int_const&>(local_230,__position_00,&l);
          }
          else {
            *__position_00._M_current = l;
            *(long *)(local_230 + 8) = *(long *)(local_230 + 8) + 4;
          }
        }
        l = *(uint *)((long)m3d->m3d_->face->texcoord + lVar17 + lVar18);
        uVar15 = (ulong)l;
        if (uVar15 != 0xffffffff) {
          pmVar5 = m3d->m3d_->tmap;
          uv.x = pmVar5[uVar15].u;
          uv.y = pmVar5[uVar15].v;
          uv.z = 0.0;
          iVar4._M_current = *(aiVector3t<float> **)(local_220 + 8);
          if (iVar4._M_current == *(aiVector3t<float> **)(local_220 + 0x10)) {
            std::vector<aiVector3t<float>,std::allocator<aiVector3t<float>>>::
            _M_realloc_insert<aiVector3t<float>const&>(local_220,iVar4,&uv);
          }
          else {
            (iVar4._M_current)->z = 0.0;
            (iVar4._M_current)->x = uv.x;
            (iVar4._M_current)->y = uv.y;
            *(long *)(local_220 + 8) = *(long *)(local_220 + 8) + 0xc;
          }
        }
        l = *(uint *)((long)m3d->m3d_->face->normal + lVar17 + lVar18);
        uVar15 = (ulong)l;
        if (uVar15 != 0xffffffff) {
          pmVar3 = m3d->m3d_->vertex;
          norm.x = pmVar3[uVar15].x;
          norm.y = pmVar3[uVar15].y;
          norm.z = pmVar3[uVar15].z;
          iVar4._M_current = *(aiVector3t<float> **)(local_228 + 8);
          if (iVar4._M_current == *(aiVector3t<float> **)(local_228 + 0x10)) {
            std::vector<aiVector3t<float>,std::allocator<aiVector3t<float>>>::
            _M_realloc_insert<aiVector3t<float>const&>(local_228,iVar4,&norm);
          }
          else {
            (iVar4._M_current)->z = norm.z;
            (iVar4._M_current)->x = norm.x;
            (iVar4._M_current)->y = norm.y;
            *(long *)(local_228 + 8) = *(long *)(local_228 + 8) + 0xc;
          }
        }
        faces = local_1b8;
        lVar17 = lVar17 + 4;
      } while (lVar17 != 0xc);
      std::vector<aiFace,_std::allocator<aiFace>_>::push_back(local_1b8,__x);
      if (__x->mIndices != (uint *)0x0) {
        operator_delete__(__x->mIndices);
      }
      operator_delete(__x,0x10);
      uVar15 = local_1b0 + 1;
      pmVar11 = m3d->m3d_;
      lVar18 = lVar18 + 0x28;
    } while (uVar15 < pmVar11->numface);
  }
  pvVar10 = local_1c0;
  pMVar9 = local_1c8;
  if (((pMesh != (aiMesh *)0x0) && (*(long *)(this_01 + 8) != *(long *)this_01)) &&
     ((faces->super__Vector_base<aiFace,_std::allocator<aiFace>_>)._M_impl.super__Vector_impl_data.
      _M_finish !=
      (faces->super__Vector_base<aiFace,_std::allocator<aiFace>_>)._M_impl.super__Vector_impl_data.
      _M_start)) {
    populateMesh(local_1c8,m3d,pMesh,faces,
                 (vector<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_> *)this_01,
                 (vector<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_> *)local_228,
                 (vector<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_> *)local_220,
                 (vector<aiColor4t<float>,_std::allocator<aiColor4t<float>_>_> *)local_218,
                 (vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_230);
    iVar6._M_current = *(aiMesh ***)(pvVar10 + 8);
    if (iVar6._M_current == *(aiMesh ***)(pvVar10 + 0x10)) {
      std::vector<aiMesh*,std::allocator<aiMesh*>>::_M_realloc_insert<aiMesh*const&>
                (pvVar10,iVar6,&pMesh);
    }
    else {
      *iVar6._M_current = pMesh;
      *(long *)(pvVar10 + 8) = *(long *)(pvVar10 + 8) + 8;
    }
  }
  pMVar9->mScene->mNumMeshes = (uint)((ulong)(*(long *)(pvVar10 + 8) - *(long *)pvVar10) >> 3);
  paVar7 = pMVar9->mScene;
  ppaVar14 = (aiMesh **)operator_new__((ulong)paVar7->mNumMeshes << 3);
  paVar7->mMeshes = ppaVar14;
  __n = *(long *)(pvVar10 + 8) - (long)*(void **)pvVar10;
  if (__n != 0) {
    memmove(pMVar9->mScene->mMeshes,*(void **)pvVar10,__n);
  }
  pMVar9->mScene->mRootNode->mNumMeshes =
       (uint)((ulong)(*(long *)(pvVar10 + 8) - *(long *)pvVar10) >> 3);
  uVar15 = 0xffffffffffffffff;
  if (-1 < *(long *)(pvVar10 + 8) - *(long *)pvVar10) {
    uVar15 = *(long *)(pvVar10 + 8) - *(long *)pvVar10 >> 1;
  }
  puVar13 = (uint *)operator_new__(uVar15);
  pMVar9->mScene->mRootNode->mMeshes = puVar13;
  pvVar16 = *(void **)pvVar10;
  if (*(void **)(pvVar10 + 8) != pvVar16) {
    uVar15 = 0;
    do {
      pMVar9->mScene->mRootNode->mMeshes[uVar15] = (uint)uVar15;
      uVar15 = (ulong)((uint)uVar15 + 1);
      pvVar16 = *(void **)pvVar10;
    } while (uVar15 < (ulong)(*(long *)(pvVar10 + 8) - (long)pvVar16 >> 3));
  }
  if (pvVar16 != (void *)0x0) {
    operator_delete(pvVar16,*(long *)(pvVar10 + 0x10) - (long)pvVar16);
  }
  operator_delete(pvVar10,0x18);
  if (faces != (vector<aiFace,_std::allocator<aiFace>_> *)0x0) {
    std::vector<aiFace,_std::allocator<aiFace>_>::~vector(faces);
    operator_delete(faces,0x18);
  }
  if (this_01 != (vector<aiVector3t<float>,std::allocator<aiVector3t<float>>> *)0x0) {
    pvVar16 = *(void **)this_01;
    if (pvVar16 != (void *)0x0) {
      operator_delete(pvVar16,*(long *)(this_01 + 0x10) - (long)pvVar16);
    }
    operator_delete(this_01,0x18);
  }
  if (local_228 != (vector<aiVector3t<float>,std::allocator<aiVector3t<float>>> *)0x0) {
    pvVar16 = *(void **)local_228;
    if (pvVar16 != (void *)0x0) {
      operator_delete(pvVar16,*(long *)(local_228 + 0x10) - (long)pvVar16);
    }
    operator_delete(local_228,0x18);
  }
  if (local_220 != (vector<aiVector3t<float>,std::allocator<aiVector3t<float>>> *)0x0) {
    pvVar16 = *(void **)local_220;
    if (pvVar16 != (void *)0x0) {
      operator_delete(pvVar16,*(long *)(local_220 + 0x10) - (long)pvVar16);
    }
    operator_delete(local_220,0x18);
  }
  if (local_218 != (vector<aiColor4t<float>,std::allocator<aiColor4t<float>>> *)0x0) {
    pvVar16 = *(void **)local_218;
    if (pvVar16 != (void *)0x0) {
      operator_delete(pvVar16,*(long *)(local_218 + 0x10) - (long)pvVar16);
    }
    operator_delete(local_218,0x18);
  }
  if (local_230 != (vector<unsigned_int,std::allocator<unsigned_int>> *)0x0) {
    pvVar16 = *(void **)local_230;
    if (pvVar16 != (void *)0x0) {
      operator_delete(pvVar16,*(long *)(local_230 + 0x10) - (long)pvVar16);
    }
    operator_delete(local_230,0x18);
  }
  return;
}

Assistant:

void M3DImporter::importMeshes(const M3DWrapper &m3d) {
	unsigned int i, j, k, l, numpoly = 3, lastMat = M3D_INDEXMAX;
	std::vector<aiMesh *> *meshes = new std::vector<aiMesh *>();
	std::vector<aiFace> *faces = nullptr;
	std::vector<aiVector3D> *vertices = nullptr;
	std::vector<aiVector3D> *normals = nullptr;
	std::vector<aiVector3D> *texcoords = nullptr;
	std::vector<aiColor4D> *colors = nullptr;
	std::vector<unsigned int> *vertexids = nullptr;
	aiMesh *pMesh = nullptr;

	ai_assert(mScene != nullptr);
	ai_assert(m3d);
	ai_assert(mScene->mRootNode != nullptr);

	ASSIMP_LOG_DEBUG_F("M3D: importMeshes ", m3d->numface);

	for (i = 0; i < m3d->numface; i++) {
		// we must switch mesh if material changes
		if (lastMat != m3d->face[i].materialid) {
			lastMat = m3d->face[i].materialid;
			if (pMesh && vertices && vertices->size() && faces && faces->size()) {
				populateMesh(m3d, pMesh, faces, vertices, normals, texcoords, colors, vertexids);
				meshes->push_back(pMesh);
				delete faces;
				delete vertices;
				delete normals;
				delete texcoords;
				delete colors;
				delete vertexids; // this is not stored in pMesh, just to collect bone vertices
			}
			pMesh = new aiMesh;
			pMesh->mPrimitiveTypes = aiPrimitiveType_TRIANGLE;
			pMesh->mMaterialIndex = lastMat + 1;
			faces = new std::vector<aiFace>();
			vertices = new std::vector<aiVector3D>();
			normals = new std::vector<aiVector3D>();
			texcoords = new std::vector<aiVector3D>();
			colors = new std::vector<aiColor4D>();
			vertexids = new std::vector<unsigned int>();
		}
		// add a face to temporary vector
		aiFace *pFace = new aiFace;
		pFace->mNumIndices = numpoly;
		pFace->mIndices = new unsigned int[numpoly];
		for (j = 0; j < numpoly; j++) {
			aiVector3D pos, uv, norm;
			k = static_cast<unsigned int>(vertices->size());
			pFace->mIndices[j] = k;
			l = m3d->face[i].vertex[j];
			pos.x = m3d->vertex[l].x;
			pos.y = m3d->vertex[l].y;
			pos.z = m3d->vertex[l].z;
			vertices->push_back(pos);
			colors->push_back(mkColor(m3d->vertex[l].color));
			// add a bone to temporary vector
			if (m3d->vertex[l].skinid != M3D_UNDEF && m3d->vertex[l].skinid != M3D_INDEXMAX && m3d->skin && m3d->bone) {
				// this is complicated, because M3D stores a list of bone id / weight pairs per
				// vertex but assimp uses lists of local vertex id/weight pairs per local bone list
				vertexids->push_back(l);
			}
			l = m3d->face[i].texcoord[j];
			if (l != M3D_UNDEF) {
				uv.x = m3d->tmap[l].u;
				uv.y = m3d->tmap[l].v;
				uv.z = 0.0;
				texcoords->push_back(uv);
			}
			l = m3d->face[i].normal[j];
			if (l != M3D_UNDEF) {
				norm.x = m3d->vertex[l].x;
				norm.y = m3d->vertex[l].y;
				norm.z = m3d->vertex[l].z;
				normals->push_back(norm);
			}
		}
		faces->push_back(*pFace);
		delete pFace;
	}
	// if there's data left in the temporary vectors, flush them
	if (pMesh && vertices->size() && faces->size()) {
		populateMesh(m3d, pMesh, faces, vertices, normals, texcoords, colors, vertexids);
		meshes->push_back(pMesh);
	}

	// create global mesh list in scene
	mScene->mNumMeshes = static_cast<unsigned int>(meshes->size());
	mScene->mMeshes = new aiMesh *[mScene->mNumMeshes];
	std::copy(meshes->begin(), meshes->end(), mScene->mMeshes);

	// create mesh indeces in root node
	mScene->mRootNode->mNumMeshes = static_cast<unsigned int>(meshes->size());
	mScene->mRootNode->mMeshes = new unsigned int[meshes->size()];
	for (i = 0; i < meshes->size(); i++) {
		mScene->mRootNode->mMeshes[i] = i;
	}

	delete meshes;
	if (faces) delete faces;
	if (vertices) delete vertices;
	if (normals) delete normals;
	if (texcoords) delete texcoords;
	if (colors) delete colors;
	if (vertexids) delete vertexids;
}